

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprMightBeIndexed(SrcList *pFrom,Bitmask mPrereq,int *aiCurCol,Expr *pExpr,int op)

{
  int *in_RCX;
  int *in_RDX;
  SrcList *in_RSI;
  int in_R8D;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  if ((((char)*in_RCX == -0x5b) && (0x35 < in_R8D)) && (in_R8D < 0x3a)) {
    in_RCX = *(int **)(*(long *)(in_RCX + 8) + 8);
  }
  if ((char)*in_RCX == -0x62) {
    *in_RDX = in_RCX[0xb];
    in_RDX[1] = (int)(short)in_RCX[0xc];
    local_4 = 1;
  }
  else if (in_RSI == (SrcList *)0x0) {
    local_4 = 0;
  }
  else if (((ulong)in_RSI & (ulong)((long)&in_RSI[-1].a[0].pIBIndex + 7U)) == 0) {
    local_4 = exprMightBeIndexed2(in_RSI,(Bitmask)in_RDX,in_RCX,
                                  (Expr *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  int *aiCurCol,         /* Write the referenced table cursor & column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int op                 /* The specific comparison operator */
){
  /* If this expression is a vector to the left or right of a 
  ** inequality constraint (>, <, >= or <=), perform the processing 
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    aiCurCol[0] = pExpr->iTable;
    aiCurCol[1] = pExpr->iColumn;
    return 1;
  }
  if( mPrereq==0 ) return 0;                 /* No table references */
  if( (mPrereq&(mPrereq-1))!=0 ) return 0;   /* Refs more than one table */
  return exprMightBeIndexed2(pFrom,mPrereq,aiCurCol,pExpr);
}